

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O2

void __thiscall
adios2::transport::FileStdio::Write(FileStdio *this,char *buffer,size_t size,size_t start)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  allocator local_f3;
  allocator local_f2;
  allocator local_f1;
  anon_class_8_1_8991fb9c lf_Write;
  string local_e8;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  lf_Write.this = this;
  WaitForOpen(this);
  if (start != 0xffffffffffffffff) {
    iVar1 = fseek((FILE *)this->m_File,start,0);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_a8,"Toolkit",&local_f1);
      std::__cxx11::string::string((string *)&local_c8,"transport::file::FileStdio",&local_f2);
      std::__cxx11::string::string((string *)&local_e8,"Write",&local_f3);
      std::operator+(&local_48,"couldn\'t move position of ",&(this->super_Transport).m_Name);
      std::operator+(&local_88,&local_48," file, in call to FileStdio Write fseek");
      helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_a8,&local_c8,&local_e8,&local_88,-1);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    std::__cxx11::to_string(&local_88,start);
    std::operator+(&local_e8,"couldn\'t move to start position ",&local_88);
    std::operator+(&local_c8,&local_e8," in file ");
    std::operator+(&local_a8,&local_c8,&(this->super_Transport).m_Name);
    std::operator+(&local_68,&local_a8,", in call to stdio fseek at write ");
    CheckFile(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_88);
  }
  if (0x7ffe7000 < size) {
    uVar2 = size / 0x7ffe7000;
    size = size % 0x7ffe7000;
    while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
      Write::anon_class_8_1_8991fb9c::operator()(&lf_Write,buffer,0x7ffe7000);
      buffer = buffer + 0x7ffe7000;
    }
  }
  Write::anon_class_8_1_8991fb9c::operator()(&lf_Write,buffer,size);
  return;
}

Assistant:

void FileStdio::Write(const char *buffer, size_t size, size_t start)
{
    auto lf_Write = [&](const char *buffer, size_t size) {
        ProfilerStart("write");
        const auto writtenSize = std::fwrite(buffer, sizeof(char), size, m_File);
        ProfilerStop("write");

        CheckFile("couldn't write to file " + m_Name + ", in call to stdio fwrite");

        if (writtenSize != size)
        {
            helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "Write",
                                                  "written size + " + std::to_string(writtenSize) +
                                                      " is not equal to intended size " +
                                                      std::to_string(size) + " in file " + m_Name +
                                                      ", in call to stdio fwrite");
        }
    };

    WaitForOpen();
    if (start != MaxSizeT)
    {
        const auto status = std::fseek(m_File, static_cast<long int>(start), SEEK_SET);
        if (status != 0)
        {
            helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "Write",
                                                  "couldn't move position of " + m_Name +
                                                      " file, in call to FileStdio Write fseek");
        }

        CheckFile("couldn't move to start position " + std::to_string(start) + " in file " +
                  m_Name + ", in call to stdio fseek at write ");
    }

    if (size > DefaultMaxFileBatchSize)
    {
        const size_t batches = size / DefaultMaxFileBatchSize;
        const size_t remainder = size % DefaultMaxFileBatchSize;

        size_t position = 0;
        for (size_t b = 0; b < batches; ++b)
        {
            lf_Write(&buffer[position], DefaultMaxFileBatchSize);
            position += DefaultMaxFileBatchSize;
        }
        lf_Write(&buffer[position], remainder);
    }
    else
    {
        lf_Write(buffer, size);
    }
}